

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Literals * __thiscall
wasm::ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner>::callFunctionInternal
          (Literals *__return_storage_ptr__,
          ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *this,Name name,
          Literals *arguments)

{
  pointer pNVar1;
  pointer pNVar2;
  char cVar3;
  Function *function;
  Type TVar4;
  pointer pNVar5;
  ostream *poVar6;
  ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *pMVar7;
  ulong uVar8;
  Type extraout_RDX;
  Type extraout_RDX_00;
  Name name_00;
  Name NVar9;
  undefined1 local_d8 [8];
  FunctionScope scope;
  Flow flow;
  Name name_local;
  
  flow.breakTo.super_IString.str._M_str = name.super_IString.str._M_len;
  uVar8 = this->callDepth;
  if (0xfa < uVar8) {
    (*this->externalInterface->_vptr_ExternalInterface[8])(this->externalInterface,"stack limit");
    uVar8 = this->callDepth;
  }
  this->callDepth = uVar8 + 1;
  pNVar1 = (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pNVar2 = (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
           .super__Vector_impl_data._M_start;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
            (&this->functionStack,(value_type *)&flow.breakTo.super_IString.str._M_str);
  NVar9.super_IString.str._M_str = flow.breakTo.super_IString.str._M_str;
  NVar9.super_IString.str._M_len = (size_t)this->wasm;
  function = (Function *)wasm::Module::getFunction(NVar9);
  if (function != (Function *)0x0) {
    pMVar7 = this;
    FunctionScope::FunctionScope
              ((FunctionScope *)local_d8,function,arguments,(EvallingModuleRunner *)this);
    ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>::visit
              ((Flow *)&scope.currDelegateTarget.super_IString.str._M_str,
               &this->super_ExpressionRunner<(anonymous_namespace)::EvallingModuleRunner>,
               function->body);
    if ((flow.breakTo.super_IString.str._M_len != 0) &&
       (pMVar7 = (ModuleRunnerBase<(anonymous_namespace)::EvallingModuleRunner> *)&RETURN_FLOW,
       flow.breakTo.super_IString.str._M_len != _getStruct)) {
      __assert_fail("!flow.breaking() || flow.breakTo == RETURN_FLOW",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0xf05,
                    "Literals wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::callFunctionInternal(Name, const Literals &) [SubType = (anonymous namespace)::EvallingModuleRunner]"
                   );
    }
    TVar4 = Literals::getType((Literals *)&scope.currDelegateTarget.super_IString.str._M_str);
    wasm::HeapType::getSignature();
    cVar3 = wasm::Type::isSubType(TVar4,extraout_RDX);
    if (cVar3 != '\0') {
      this->callDepth = uVar8;
      pNVar5 = (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (uVar8 = (long)pNVar5 -
                   (long)(this->functionStack).
                         super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                         super__Vector_impl_data._M_start; pNVar5 = pNVar5 + -1,
          (ulong)((long)pNVar1 - (long)pNVar2) < uVar8; uVar8 = uVar8 - 0x10) {
        (this->functionStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_finish = pNVar5;
      }
      SmallVector<wasm::Literal,_1UL>::SmallVector
                (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,
                 (SmallVector<wasm::Literal,_1UL> *)
                 &scope.currDelegateTarget.super_IString.str._M_str);
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)
                 &scope.currDelegateTarget.super_IString.str._M_str);
      FunctionScope::~FunctionScope((FunctionScope *)local_d8);
      return __return_storage_ptr__;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,"calling ");
    name_00.super_IString.str._M_str = (char *)pMVar7;
    name_00.super_IString.str._M_len =
         (size_t)(function->super_Importable).super_Named.name.super_IString.str._M_str;
    poVar6 = operator<<((wasm *)poVar6,
                        (ostream *)
                        (function->super_Importable).super_Named.name.super_IString.str._M_len,
                        name_00);
    poVar6 = std::operator<<(poVar6," resulted in ");
    poVar6 = (ostream *)wasm::operator<<(poVar6,TVar4);
    poVar6 = std::operator<<(poVar6," but the function type is ");
    wasm::HeapType::getSignature();
    poVar6 = (ostream *)wasm::operator<<(poVar6,extraout_RDX_00);
    std::operator<<(poVar6,'\n');
    wasm::handle_unreachable
              ("unexpected result type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
               ,0xf0b);
  }
  __assert_fail("function",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                ,0xef9,
                "Literals wasm::ModuleRunnerBase<(anonymous namespace)::EvallingModuleRunner>::callFunctionInternal(Name, const Literals &) [SubType = (anonymous namespace)::EvallingModuleRunner]"
               );
}

Assistant:

Literals callFunctionInternal(Name name, const Literals& arguments) {
    if (callDepth > maxDepth) {
      externalInterface->trap("stack limit");
    }
    auto previousCallDepth = callDepth;
    callDepth++;
    auto previousFunctionStackSize = functionStack.size();
    functionStack.push_back(name);

    Function* function = wasm.getFunction(name);
    assert(function);
    FunctionScope scope(function, arguments, *self());

#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "entering " << function->name << "\n  with arguments:\n";
    for (unsigned i = 0; i < arguments.size(); ++i) {
      std::cout << "    $" << i << ": " << arguments[i] << '\n';
    }
#endif

    Flow flow = self()->visit(function->body);
    // cannot still be breaking, it means we missed our stop
    assert(!flow.breaking() || flow.breakTo == RETURN_FLOW);
    auto type = flow.getType();
    if (!Type::isSubType(type, function->getResults())) {
      std::cerr << "calling " << function->name << " resulted in " << type
                << " but the function type is " << function->getResults()
                << '\n';
      WASM_UNREACHABLE("unexpected result type");
    }
    // may decrease more than one, if we jumped up the stack
    callDepth = previousCallDepth;
    // if we jumped up the stack, we also need to pop higher frames
    // TODO can FunctionScope handle this automatically?
    while (functionStack.size() > previousFunctionStackSize) {
      functionStack.pop_back();
    }
#ifdef WASM_INTERPRETER_DEBUG
    std::cout << "exiting " << function->name << " with " << flow.values
              << '\n';
#endif
    return flow.values;
  }